

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FZFile.cpp
# Opt level: O2

string * __thiscall
FZFile::fz_key_to_string<44ul>
          (string *__return_storage_ptr__,FZFile *this,array<unsigned_int,_44UL> *fzkey)

{
  long lVar1;
  ostream *poVar2;
  size_t j;
  long lVar3;
  size_t i;
  ulong uVar4;
  stringstream sstr;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&sstr);
  for (uVar4 = 0; uVar4 < 0x2c; uVar4 = uVar4 + 4) {
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      poVar2 = std::operator<<(local_1a8," 0x");
      poVar2 = std::operator<<(poVar2,0x30);
      lVar1 = *(long *)poVar2;
      *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 8;
      lVar1 = *(long *)(lVar1 + -0x18);
      *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffffb5 | 8;
      std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    }
    std::endl<char,std::char_traits<char>>(local_1a8);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&sstr);
  return __return_storage_ptr__;
}

Assistant:

std::string FZFile::fz_key_to_string(const std::array<uint32_t, N> &fzkey) {
	std::stringstream sstr;
	for (size_t i = 0; i < N; i += 4) {
		for (size_t j = 0; j < 4; j++) {
			sstr << " 0x" << std::setfill ('0') << std::setw(8) << std::hex << fzkey[i + j];
		}
		sstr << std::endl;
	}
	return sstr.str();
}